

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_CleanupAfterInitFailure_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_CleanupAfterInitFailure_Test>
           *this)

{
  Test *this_00;
  ParameterizedTestFactory<(anonymous_namespace)::PerAEADTest_CleanupAfterInitFailure_Test>
  *this_local;
  
  WithParamInterface<(anonymous_namespace)::KnownAEAD>::SetParam(&this->parameter_);
  this_00 = (Test *)operator_new(0x18);
  anon_unknown.dwarf_d4e6f::PerAEADTest_CleanupAfterInitFailure_Test::
  PerAEADTest_CleanupAfterInitFailure_Test((PerAEADTest_CleanupAfterInitFailure_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }